

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  CURL *curl_00;
  bool bVar2;
  __type _Var3;
  byte bVar4;
  size_type sVar5;
  reference pbVar6;
  char *pcVar7;
  pointer pbVar8;
  auto_ptr_ref<cmCryptoHash> r;
  undefined8 uVar9;
  ulong uVar10;
  ostream *poVar11;
  cmCryptoHash *pcVar12;
  reference value;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f50;
  value_type_conflict1 local_f41;
  string local_f40;
  undefined1 local_f20 [8];
  ostringstream oss;
  allocator local_da1;
  string local_da0;
  undefined1 local_d80 [8];
  string actualHash_1;
  ostringstream local_d40 [8];
  ostringstream result_1;
  allocator local_bc1;
  undefined1 local_bc0 [8];
  string e_14;
  undefined1 local_b98 [8];
  string e_13;
  undefined1 local_b70 [8];
  string e_12;
  cURLProgressHelper helper;
  undefined1 local_b18 [8];
  string e_11;
  undefined1 local_af0 [8];
  string e_10;
  undefined1 local_ac8 [8];
  string e_9;
  undefined1 local_aa0 [8];
  string e_8;
  undefined1 local_a78 [8];
  string e_7;
  cmFileCommandVectorOfChar chunkDebug;
  string *cainfo_err;
  undefined1 local_a10 [8];
  string e_6;
  undefined1 local_9e8 [8];
  string e_5;
  undefined1 local_9c0 [8];
  string e_4;
  undefined1 local_998 [8];
  string e_3;
  undefined1 local_970 [8];
  string e_2;
  undefined1 local_948 [8];
  string e_1;
  undefined1 local_920 [8];
  string e;
  CURLcode res;
  cURLEasyGuard g_curl;
  string local_8e8;
  CURL *local_8c8;
  CURL *curl;
  string local_8b8;
  long local_898;
  ofstream fout;
  undefined1 local_678 [8];
  string errstring;
  string dir;
  ostringstream local_618 [8];
  ostringstream result;
  undefined1 local_4a0 [8];
  string actualHash;
  string msg;
  allocator local_439;
  undefined1 local_438 [8];
  string err_1;
  auto_ptr<cmCryptoHash> local_408;
  cmCryptoHash *local_400;
  string local_3f8;
  string local_3d8;
  undefined1 local_3b8 [8];
  string algo;
  undefined1 local_390 [8];
  string err;
  size_type pos;
  string local_360;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  string local_338;
  cmCryptoHash local_318;
  cmCryptoHash *local_310;
  auto_ptr local_308 [8];
  cmCryptoHash *local_300;
  allocator local_2f1;
  string local_2f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  allocator local_2c1;
  string local_2c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a0;
  allocator local_291;
  string local_290;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  allocator local_261;
  string local_260;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  allocator local_231;
  string local_230;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  allocator local_201;
  string local_200;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  int local_1d8;
  allocator local_1d1;
  string local_1d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  byte local_199;
  bool showProgress;
  auto_ptr<cmCryptoHash> hash;
  string hashMatchMSG;
  string expectedHash;
  string local_148;
  char *local_128;
  char *cainfo;
  string local_118;
  byte local_f1;
  undefined1 local_f0 [7];
  bool tls_verify;
  string statusVar;
  string logVar;
  long inactivity_timeout;
  long timeout;
  string file;
  string url;
  allocator local_49;
  string local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i._M_current);
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"DOWNLOAD must be called with at least three arguments.",
               &local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_005bfbec;
  }
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  pbVar6 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
  std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8),(string *)pbVar6);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  pbVar6 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
  std::__cxx11::string::string((string *)&timeout,(string *)pbVar6);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  inactivity_timeout = 0;
  logVar.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"CMAKE_TLS_VERIFY",(allocator *)((long)&cainfo + 7));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo + 7));
  pcVar1 = (this->super_cmCommand).Makefile;
  local_f1 = bVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"CMAKE_TLS_CAINFO",
             (allocator *)(expectedHash.field_2._M_local_buf + 0xf));
  pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(expectedHash.field_2._M_local_buf + 0xf));
  local_128 = pcVar7;
  std::__cxx11::string::string((string *)(hashMatchMSG.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&hash);
  cmsys::auto_ptr<cmCryptoHash>::auto_ptr
            ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68,(cmCryptoHash *)0x0);
  local_199 = 0;
  while( true ) {
    local_1a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(i._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_1a8);
    if (!bVar2) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_28);
    bVar2 = std::operator==(pbVar6,"TIMEOUT");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_28);
      local_1b0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(i._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_28,&local_1b0);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1d0,"DOWNLOAD missing time for TIMEOUT.",&local_1d1);
        cmCommand::SetError(&this->super_cmCommand,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        this_local._7_1_ = 0;
        local_1d8 = 1;
        goto LAB_005bfb46;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_28);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      inactivity_timeout = atol(pcVar7);
    }
    else {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
      bVar2 = std::operator==(pbVar6,"INACTIVITY_TIMEOUT");
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_28);
        local_1e0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(i._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_28,&local_1e0);
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_200,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.",&local_201
                    );
          cmCommand::SetError(&this->super_cmCommand,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator((allocator<char> *)&local_201);
          this_local._7_1_ = 0;
          local_1d8 = 1;
          goto LAB_005bfb46;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_28);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        logVar.field_2._8_8_ = atol(pcVar7);
      }
      else {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_28);
        bVar2 = std::operator==(pbVar6,"LOG");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_28);
          local_210._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(i._M_current);
          bVar2 = __gnu_cxx::operator==(&local_28,&local_210);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_230,"DOWNLOAD missing VAR for LOG.",&local_231);
            cmCommand::SetError(&this->super_cmCommand,&local_230);
            std::__cxx11::string::~string((string *)&local_230);
            std::allocator<char>::~allocator((allocator<char> *)&local_231);
            this_local._7_1_ = 0;
            local_1d8 = 1;
            goto LAB_005bfb46;
          }
          pbVar6 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
          std::__cxx11::string::operator=
                    ((string *)(statusVar.field_2._M_local_buf + 8),(string *)pbVar6);
        }
        else {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
          bVar2 = std::operator==(pbVar6,"STATUS");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_28);
            local_240._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(i._M_current);
            bVar2 = __gnu_cxx::operator==(&local_28,&local_240);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_260,"DOWNLOAD missing VAR for STATUS.",&local_261);
              cmCommand::SetError(&this->super_cmCommand,&local_260);
              std::__cxx11::string::~string((string *)&local_260);
              std::allocator<char>::~allocator((allocator<char> *)&local_261);
              this_local._7_1_ = 0;
              local_1d8 = 1;
              goto LAB_005bfb46;
            }
            pbVar6 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_28);
            std::__cxx11::string::operator=((string *)local_f0,(string *)pbVar6);
          }
          else {
            pbVar6 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_28);
            bVar2 = std::operator==(pbVar6,"TLS_VERIFY");
            if (bVar2) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_28);
              local_270._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(i._M_current);
              bVar2 = __gnu_cxx::operator!=(&local_28,&local_270);
              if (!bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_290,"TLS_VERIFY missing bool value.",&local_291);
                cmCommand::SetError(&this->super_cmCommand,&local_290);
                std::__cxx11::string::~string((string *)&local_290);
                std::allocator<char>::~allocator((allocator<char> *)&local_291);
                this_local._7_1_ = 0;
                local_1d8 = 1;
                goto LAB_005bfb46;
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_28);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              local_f1 = cmSystemTools::IsOn(pcVar7);
            }
            else {
              pbVar6 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_28);
              bVar2 = std::operator==(pbVar6,"TLS_CAINFO");
              if (bVar2) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_28);
                local_2a0._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(i._M_current);
                bVar2 = __gnu_cxx::operator!=(&local_28,&local_2a0);
                if (!bVar2) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_2c0,"TLS_CAFILE missing file value.",&local_2c1);
                  cmCommand::SetError(&this->super_cmCommand,&local_2c0);
                  std::__cxx11::string::~string((string *)&local_2c0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                  this_local._7_1_ = 0;
                  local_1d8 = 1;
                  goto LAB_005bfb46;
                }
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator->(&local_28);
                local_128 = (char *)std::__cxx11::string::c_str();
              }
              else {
                pbVar6 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_28);
                bVar2 = std::operator==(pbVar6,"EXPECTED_MD5");
                if (bVar2) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_28);
                  local_2d0._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(i._M_current);
                  bVar2 = __gnu_cxx::operator==(&local_28,&local_2d0);
                  if (bVar2) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_2f0,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                               &local_2f1);
                    cmCommand::SetError(&this->super_cmCommand,&local_2f0);
                    std::__cxx11::string::~string((string *)&local_2f0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
                    this_local._7_1_ = 0;
                    local_1d8 = 1;
                    goto LAB_005bfb46;
                  }
                  cmCryptoHash::New(&local_318,"MD5");
                  local_310 = (cmCryptoHash *)
                              cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_318)
                  ;
                  cmsys::auto_ptr<cmCryptoHash>::auto_ptr
                            ((auto_ptr<cmCryptoHash> *)local_308,
                             (auto_ptr_ref<cmCryptoHash>)local_310);
                  local_300 = (cmCryptoHash *)
                              cmsys::auto_ptr::operator_cast_to_auto_ptr_ref(local_308);
                  cmsys::auto_ptr<cmCryptoHash>::operator=
                            ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68,
                             (auto_ptr_ref<cmCryptoHash>)local_300);
                  cmsys::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)local_308);
                  cmsys::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)&local_318);
                  std::__cxx11::string::operator=((string *)&hash,"MD5 sum");
                  pbVar6 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_28);
                  cmsys::SystemTools::LowerCase(&local_338,pbVar6);
                  std::__cxx11::string::operator=
                            ((string *)(hashMatchMSG.field_2._M_local_buf + 8),(string *)&local_338)
                  ;
                  std::__cxx11::string::~string((string *)&local_338);
                }
                else {
                  pbVar6 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_28);
                  bVar2 = std::operator==(pbVar6,"SHOW_PROGRESS");
                  if (bVar2) {
                    local_199 = 1;
                  }
                  else {
                    pbVar6 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_28);
                    bVar2 = std::operator==(pbVar6,"EXPECTED_HASH");
                    if (bVar2) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&local_28);
                      local_340._M_current =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(i._M_current);
                      bVar2 = __gnu_cxx::operator==(&local_28,&local_340);
                      if (bVar2) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_360,
                                   "DOWNLOAD missing ALGO=value for EXPECTED_HASH.",
                                   (allocator *)((long)&pos + 7));
                        cmCommand::SetError(&this->super_cmCommand,&local_360);
                        std::__cxx11::string::~string((string *)&local_360);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
                        this_local._7_1_ = 0;
                        local_1d8 = 1;
                        goto LAB_005bfb46;
                      }
                      pbVar8 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator->(&local_28);
                      err.field_2._8_8_ = std::__cxx11::string::find((char *)pbVar8,0x8e885a);
                      if (err.field_2._8_8_ == -1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_390,
                                   "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ",
                                   (allocator *)(algo.field_2._M_local_buf + 0xf));
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(algo.field_2._M_local_buf + 0xf));
                        pbVar6 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_28);
                        std::__cxx11::string::operator+=((string *)local_390,(string *)pbVar6);
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_390);
                        this_local._7_1_ = 0;
                        local_1d8 = 1;
                        std::__cxx11::string::~string((string *)local_390);
                        goto LAB_005bfb46;
                      }
                      pbVar8 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator->(&local_28);
                      std::__cxx11::string::substr((ulong)local_3b8,(ulong)pbVar8);
                      pbVar8 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator->(&local_28);
                      std::__cxx11::string::substr((ulong)&local_3f8,(ulong)pbVar8);
                      cmsys::SystemTools::LowerCase(&local_3d8,&local_3f8);
                      std::__cxx11::string::operator=
                                ((string *)(hashMatchMSG.field_2._M_local_buf + 8),
                                 (string *)&local_3d8);
                      std::__cxx11::string::~string((string *)&local_3d8);
                      std::__cxx11::string::~string((string *)&local_3f8);
                      pcVar7 = (char *)std::__cxx11::string::c_str();
                      cmCryptoHash::New((cmCryptoHash *)((long)&err_1.field_2 + 8),pcVar7);
                      r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref
                                    ((auto_ptr *)(err_1.field_2._M_local_buf + 8));
                      cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_408,r);
                      local_400 = (cmCryptoHash *)
                                  cmsys::auto_ptr::operator_cast_to_auto_ptr_ref
                                            ((auto_ptr *)&local_408);
                      cmsys::auto_ptr<cmCryptoHash>::operator=
                                ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68,
                                 (auto_ptr_ref<cmCryptoHash>)local_400);
                      cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_408);
                      cmsys::auto_ptr<cmCryptoHash>::~auto_ptr
                                ((auto_ptr<cmCryptoHash> *)((long)&err_1.field_2 + 8));
                      pcVar12 = cmsys::auto_ptr<cmCryptoHash>::get
                                          ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68);
                      if (pcVar12 == (cmCryptoHash *)0x0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_438,"DOWNLOAD EXPECTED_HASH given unknown ALGO: "
                                   ,&local_439);
                        std::allocator<char>::~allocator((allocator<char> *)&local_439);
                        std::__cxx11::string::operator+=((string *)local_438,(string *)local_3b8);
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_438);
                        this_local._7_1_ = 0;
                        local_1d8 = 1;
                        std::__cxx11::string::~string((string *)local_438);
                      }
                      else {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&msg.field_2 + 8),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_3b8," hash");
                        std::__cxx11::string::operator=
                                  ((string *)&hash,(string *)(msg.field_2._M_local_buf + 8));
                        std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
                        local_1d8 = 0;
                      }
                      std::__cxx11::string::~string((string *)local_3b8);
                      if (local_1d8 != 0) goto LAB_005bfb46;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileExists(pcVar7);
  if ((bVar2) &&
     (pcVar12 = cmsys::auto_ptr<cmCryptoHash>::get
                          ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68),
     pcVar12 != (cmCryptoHash *)0x0)) {
    std::__cxx11::string::string((string *)(actualHash.field_2._M_local_buf + 8));
    pcVar12 = cmsys::auto_ptr<cmCryptoHash>::operator->
                        ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68);
    cmCryptoHash::HashFile((string *)local_4a0,pcVar12,(string *)&timeout);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_4a0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&hashMatchMSG.field_2 + 8));
    if (_Var3) {
      std::__cxx11::string::operator=
                ((string *)(actualHash.field_2._M_local_buf + 8),
                 "returning early; file already exists with expected ");
      std::__cxx11::string::operator+=
                ((string *)(actualHash.field_2._M_local_buf + 8),(string *)&hash);
      std::__cxx11::string::operator+=((string *)(actualHash.field_2._M_local_buf + 8),"\"");
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_618);
        poVar11 = (ostream *)std::ostream::operator<<(local_618,0);
        poVar11 = std::operator<<(poVar11,";\"");
        std::operator<<(poVar11,(string *)(actualHash.field_2._M_local_buf + 8));
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar7);
        std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream(local_618);
      }
      this_local._7_1_ = 1;
      local_1d8 = 1;
    }
    else {
      local_1d8 = 0;
    }
    std::__cxx11::string::~string((string *)local_4a0);
    std::__cxx11::string::~string((string *)(actualHash.field_2._M_local_buf + 8));
    if (local_1d8 == 0) goto LAB_005be012;
  }
  else {
LAB_005be012:
    cmsys::SystemTools::GetFilenamePath((string *)((long)&errstring.field_2 + 8),(string *)&timeout)
    ;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar7);
    if (bVar2) {
LAB_005be142:
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(&local_898,pcVar7,_S_bin);
      bVar4 = std::ios::operator!((ios *)((long)&local_898 + *(long *)(local_898 + -0x18)));
      if ((bVar4 & 1) == 0) {
        curl_global_init(3);
        local_8c8 = curl_easy_init();
        if (local_8c8 == (CURL *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_8e8,"DOWNLOAD error initializing curl.",
                     (allocator *)((long)&g_curl.Easy + 7));
          cmCommand::SetError(&this->super_cmCommand,&local_8e8);
          std::__cxx11::string::~string((string *)&local_8e8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&g_curl.Easy + 7));
          this_local._7_1_ = 0;
          local_1d8 = 1;
        }
        else {
          anon_unknown.dwarf_2dc1b7::cURLEasyGuard::cURLEasyGuard
                    ((cURLEasyGuard *)&stack0xfffffffffffff708,local_8c8);
          curl_00 = local_8c8;
          uVar9 = std::__cxx11::string::c_str();
          e.field_2._12_4_ = curl_easy_setopt(curl_00,CURLOPT_URL,uVar9);
          if (e.field_2._12_4_ == CURLE_OK) {
            e.field_2._12_4_ = curl_easy_setopt(local_8c8,CURLOPT_FAILONERROR,1);
            if (e.field_2._12_4_ == CURLE_OK) {
              e.field_2._12_4_ = curl_easy_setopt(local_8c8,CURLOPT_USERAGENT,"curl/7.38.0");
              if (e.field_2._12_4_ == CURLE_OK) {
                e.field_2._12_4_ =
                     curl_easy_setopt(local_8c8,CURLOPT_WRITEFUNCTION,
                                      anon_unknown.dwarf_2dc1b7::cmWriteToFileCallback);
                if (e.field_2._12_4_ == CURLE_OK) {
                  e.field_2._12_4_ =
                       curl_easy_setopt(local_8c8,CURLOPT_DEBUGFUNCTION,
                                        anon_unknown.dwarf_2dc1b7::cmFileCommandCurlDebugCallback);
                  if (e.field_2._12_4_ == CURLE_OK) {
                    if ((local_f1 & 1) == 0) {
                      e.field_2._12_4_ = curl_easy_setopt(local_8c8,CURLOPT_SSL_VERIFYPEER,0);
                      if (e.field_2._12_4_ == CURLE_OK) goto LAB_005beac5;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)local_a10,"Unable to set TLS/SSL Verify off: ",
                                 (allocator *)((long)&cainfo_err + 7));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo_err + 7));
                      pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                      std::__cxx11::string::operator+=((string *)local_a10,pcVar7);
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_a10);
                      this_local._7_1_ = 0;
                      local_1d8 = 1;
                      std::__cxx11::string::~string((string *)local_a10);
                    }
                    else {
                      e.field_2._12_4_ = curl_easy_setopt(local_8c8,CURLOPT_SSL_VERIFYPEER,1);
                      if (e.field_2._12_4_ == CURLE_OK) {
LAB_005beac5:
                        cmCurlSetCAInfo_abi_cxx11_
                                  ((string *)
                                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.field_0x10,local_8c8,local_128);
                        uVar10 = std::__cxx11::string::empty();
                        if ((uVar10 & 1) == 0) {
                          cmCommand::SetError(&this->super_cmCommand,
                                              (string *)
                                              &chunkDebug.
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.field_0x10);
                          this_local._7_1_ = 0;
                          local_1d8 = 1;
                        }
                        else {
                          std::vector<char,_std::allocator<char>_>::vector
                                    ((vector<char,_std::allocator<char>_> *)((long)&e_7.field_2 + 8)
                                    );
                          e.field_2._12_4_ =
                               curl_easy_setopt(local_8c8,CURLOPT_WRITEDATA,&local_898);
                          if (e.field_2._12_4_ == CURLE_OK) {
                            e.field_2._12_4_ =
                                 curl_easy_setopt(local_8c8,CURLOPT_DEBUGDATA,
                                                  (undefined1 *)((long)&e_7.field_2 + 8));
                            if (e.field_2._12_4_ == CURLE_OK) {
                              e.field_2._12_4_ =
                                   curl_easy_setopt(local_8c8,CURLOPT_FOLLOWLOCATION,1);
                              if (e.field_2._12_4_ == CURLE_OK) {
                                uVar10 = std::__cxx11::string::empty();
                                if ((uVar10 & 1) == 0) {
                                  e.field_2._12_4_ = curl_easy_setopt(local_8c8,CURLOPT_VERBOSE,1);
                                  if (e.field_2._12_4_ != CURLE_OK) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)local_af0,"DOWNLOAD cannot set verbose: ",
                                               (allocator *)(e_11.field_2._M_local_buf + 0xf));
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)(e_11.field_2._M_local_buf + 0xf))
                                    ;
                                    pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_af0,pcVar7);
                                    cmCommand::SetError(&this->super_cmCommand,(string *)local_af0);
                                    this_local._7_1_ = 0;
                                    local_1d8 = 1;
                                    std::__cxx11::string::~string((string *)local_af0);
                                    goto LAB_005bfaba;
                                  }
                                  e.field_2._12_4_ = 0;
                                }
                                if (0 < inactivity_timeout) {
                                  e.field_2._12_4_ =
                                       curl_easy_setopt(local_8c8,CURLOPT_TIMEOUT,inactivity_timeout
                                                       );
                                  if (e.field_2._12_4_ != CURLE_OK) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)local_b18,"DOWNLOAD cannot set timeout: ",
                                               (allocator *)(helper.Text.field_2._M_local_buf + 0xf)
                                              );
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               (helper.Text.field_2._M_local_buf + 0xf));
                                    pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_b18,pcVar7);
                                    cmCommand::SetError(&this->super_cmCommand,(string *)local_b18);
                                    this_local._7_1_ = 0;
                                    local_1d8 = 1;
                                    std::__cxx11::string::~string((string *)local_b18);
                                    goto LAB_005bfaba;
                                  }
                                  e.field_2._12_4_ = 0;
                                }
                                if (0 < (long)logVar.field_2._8_8_) {
                                  curl_easy_setopt(local_8c8,CURLOPT_LOW_SPEED_LIMIT,1);
                                  curl_easy_setopt(local_8c8,CURLOPT_LOW_SPEED_TIME,
                                                   logVar.field_2._8_8_);
                                }
                                anon_unknown.dwarf_2dc1b7::cURLProgressHelper::cURLProgressHelper
                                          ((cURLProgressHelper *)((long)&e_12.field_2 + 8),this,
                                           "download");
                                if ((local_199 & 1) == 0) {
LAB_005bf458:
                                  e.field_2._12_4_ = curl_easy_perform(local_8c8);
                                  anon_unknown.dwarf_2dc1b7::cURLEasyGuard::release
                                            ((cURLEasyGuard *)&stack0xfffffffffffff708);
                                  curl_easy_cleanup(local_8c8);
                                  uVar10 = std::__cxx11::string::empty();
                                  if ((uVar10 & 1) == 0) {
                                    std::__cxx11::ostringstream::ostringstream(local_d40);
                                    poVar11 = (ostream *)
                                              std::ostream::operator<<(local_d40,e.field_2._12_4_);
                                    poVar11 = std::operator<<(poVar11,";\"");
                                    pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                    poVar11 = std::operator<<(poVar11,pcVar7);
                                    std::operator<<(poVar11,"\"");
                                    pcVar1 = (this->super_cmCommand).Makefile;
                                    std::__cxx11::ostringstream::str();
                                    pcVar7 = (char *)std::__cxx11::string::c_str();
                                    cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar7);
                                    std::__cxx11::string::~string
                                              ((string *)(actualHash_1.field_2._M_local_buf + 8));
                                    std::__cxx11::ostringstream::~ostringstream(local_d40);
                                  }
                                  curl_global_cleanup();
                                  std::ostream::flush();
                                  std::ofstream::close();
                                  pcVar12 = cmsys::auto_ptr<cmCryptoHash>::get
                                                      ((auto_ptr<cmCryptoHash> *)
                                                       &stack0xfffffffffffffe68);
                                  if (pcVar12 != (cmCryptoHash *)0x0) {
                                    pcVar12 = cmsys::auto_ptr<cmCryptoHash>::operator->
                                                        ((auto_ptr<cmCryptoHash> *)
                                                         &stack0xfffffffffffffe68);
                                    cmCryptoHash::HashFile
                                              ((string *)local_d80,pcVar12,(string *)&timeout);
                                    uVar10 = std::__cxx11::string::empty();
                                    if ((uVar10 & 1) == 0) {
                                      bVar2 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&hashMatchMSG.field_2 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d80);
                                      if (bVar2) {
                                        std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)local_f20);
                                        poVar11 = std::operator<<((ostream *)local_f20,
                                                                  "DOWNLOAD HASH mismatch");
                                        poVar11 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar11,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar11 = std::operator<<(poVar11,"  for file: [");
                                        poVar11 = std::operator<<(poVar11,(string *)&timeout);
                                        poVar11 = std::operator<<(poVar11,"]");
                                        poVar11 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar11,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar11 = std::operator<<(poVar11,"    expected hash: [");
                                        poVar11 = std::operator<<(poVar11,(string *)
                                                                          (hashMatchMSG.field_2.
                                                                           _M_local_buf + 8));
                                        poVar11 = std::operator<<(poVar11,"]");
                                        poVar11 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar11,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar11 = std::operator<<(poVar11,"      actual hash: [");
                                        poVar11 = std::operator<<(poVar11,(string *)local_d80);
                                        poVar11 = std::operator<<(poVar11,"]");
                                        poVar11 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar11,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar11 = std::operator<<(poVar11,"           status: [");
                                        poVar11 = (ostream *)
                                                  std::ostream::operator<<(poVar11,e.field_2._12_4_)
                                        ;
                                        poVar11 = std::operator<<(poVar11,";\"");
                                        pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                        poVar11 = std::operator<<(poVar11,pcVar7);
                                        poVar11 = std::operator<<(poVar11,"\"]");
                                        std::ostream::operator<<
                                                  (poVar11,std::endl<char,std::char_traits<char>>);
                                        std::__cxx11::ostringstream::str();
                                        cmCommand::SetError(&this->super_cmCommand,&local_f40);
                                        std::__cxx11::string::~string((string *)&local_f40);
                                        this_local._7_1_ = 0;
                                        local_1d8 = 1;
                                        std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)local_f20);
                                      }
                                      else {
                                        local_1d8 = 0;
                                      }
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_da0,
                                                 "DOWNLOAD cannot compute hash on downloaded file",
                                                 &local_da1);
                                      cmCommand::SetError(&this->super_cmCommand,&local_da0);
                                      std::__cxx11::string::~string((string *)&local_da0);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_da1);
                                      this_local._7_1_ = 0;
                                      local_1d8 = 1;
                                    }
                                    std::__cxx11::string::~string((string *)local_d80);
                                    if (local_1d8 != 0) goto LAB_005bfa9e;
                                  }
                                  uVar10 = std::__cxx11::string::empty();
                                  if ((uVar10 & 1) == 0) {
                                    local_f41 = '\0';
                                    std::vector<char,_std::allocator<char>_>::push_back
                                              ((vector<char,_std::allocator<char>_> *)
                                               ((long)&e_7.field_2 + 8),&local_f41);
                                    pcVar1 = (this->super_cmCommand).Makefile;
                                    local_f50._M_current =
                                         (char *)std::vector<char,_std::allocator<char>_>::begin
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            ((long)&e_7.field_2 + 8));
                                    value = __gnu_cxx::
                                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                            ::operator*(&local_f50);
                                    cmMakefile::AddDefinition
                                              (pcVar1,(string *)((long)&statusVar.field_2 + 8),value
                                              );
                                  }
                                  this_local._7_1_ = 1;
                                  local_1d8 = 1;
                                }
                                else {
                                  e.field_2._12_4_ =
                                       curl_easy_setopt(local_8c8,CURLOPT_NOPROGRESS,0);
                                  if (e.field_2._12_4_ == CURLE_OK) {
                                    e.field_2._12_4_ =
                                         curl_easy_setopt(local_8c8,CURLOPT_PROGRESSFUNCTION,
                                                          anon_unknown.dwarf_2dc1b7::
                                                          cmFileDownloadProgressCallback);
                                    if (e.field_2._12_4_ == CURLE_OK) {
                                      e.field_2._12_4_ =
                                           curl_easy_setopt(local_8c8,CURLOPT_PROGRESSDATA,
                                                            (undefined1 *)((long)&e_12.field_2 + 8))
                                      ;
                                      if (e.field_2._12_4_ == CURLE_OK) {
                                        e.field_2._12_4_ = 0;
                                        goto LAB_005bf458;
                                      }
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)local_bc0,
                                                 "DOWNLOAD cannot set progress data: ",&local_bc1);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_bc1);
                                      pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_bc0,pcVar7);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_bc0
                                                         );
                                      this_local._7_1_ = 0;
                                      local_1d8 = 1;
                                      std::__cxx11::string::~string((string *)local_bc0);
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)local_b98,
                                                 "DOWNLOAD cannot set progress function: ",
                                                 (allocator *)(e_14.field_2._M_local_buf + 0xf));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (e_14.field_2._M_local_buf + 0xf));
                                      pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_b98,pcVar7);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_b98
                                                         );
                                      this_local._7_1_ = 0;
                                      local_1d8 = 1;
                                      std::__cxx11::string::~string((string *)local_b98);
                                    }
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)local_b70,
                                               "DOWNLOAD cannot set noprogress value: ",
                                               (allocator *)(e_13.field_2._M_local_buf + 0xf));
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)(e_13.field_2._M_local_buf + 0xf))
                                    ;
                                    pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_b70,pcVar7);
                                    cmCommand::SetError(&this->super_cmCommand,(string *)local_b70);
                                    this_local._7_1_ = 0;
                                    local_1d8 = 1;
                                    std::__cxx11::string::~string((string *)local_b70);
                                  }
                                }
LAB_005bfa9e:
                                anon_unknown.dwarf_2dc1b7::cURLProgressHelper::~cURLProgressHelper
                                          ((cURLProgressHelper *)((long)&e_12.field_2 + 8));
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)local_ac8,
                                           "DOWNLOAD cannot set follow-redirect option: ",
                                           (allocator *)(e_10.field_2._M_local_buf + 0xf));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                                pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_ac8,pcVar7);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_ac8);
                                this_local._7_1_ = 0;
                                local_1d8 = 1;
                                std::__cxx11::string::~string((string *)local_ac8);
                              }
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)local_aa0,"DOWNLOAD cannot set debug data: ",
                                         (allocator *)(e_9.field_2._M_local_buf + 0xf));
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                              pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                              std::__cxx11::string::operator+=((string *)local_aa0,pcVar7);
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_aa0);
                              this_local._7_1_ = 0;
                              local_1d8 = 1;
                              std::__cxx11::string::~string((string *)local_aa0);
                            }
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)local_a78,"DOWNLOAD cannot set write data: ",
                                       (allocator *)(e_8.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                            pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_a78,pcVar7);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_a78);
                            this_local._7_1_ = 0;
                            local_1d8 = 1;
                            std::__cxx11::string::~string((string *)local_a78);
                          }
LAB_005bfaba:
                          std::vector<char,_std::allocator<char>_>::~vector
                                    ((vector<char,_std::allocator<char>_> *)((long)&e_7.field_2 + 8)
                                    );
                        }
                        std::__cxx11::string::~string
                                  ((string *)
                                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.field_0x10);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_9e8,"Unable to set TLS/SSL Verify on: ",
                                   (allocator *)(e_6.field_2._M_local_buf + 0xf));
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                        pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                        std::__cxx11::string::operator+=((string *)local_9e8,pcVar7);
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_9e8);
                        this_local._7_1_ = 0;
                        local_1d8 = 1;
                        std::__cxx11::string::~string((string *)local_9e8);
                      }
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)local_9c0,"DOWNLOAD cannot set debug function: ",
                               (allocator *)(e_5.field_2._M_local_buf + 0xf));
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(e_5.field_2._M_local_buf + 0xf));
                    pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_9c0,pcVar7);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_9c0);
                    this_local._7_1_ = 0;
                    local_1d8 = 1;
                    std::__cxx11::string::~string((string *)local_9c0);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)local_998,"DOWNLOAD cannot set write function: ",
                             (allocator *)(e_4.field_2._M_local_buf + 0xf));
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
                  pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                  std::__cxx11::string::operator+=((string *)local_998,pcVar7);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_998);
                  this_local._7_1_ = 0;
                  local_1d8 = 1;
                  std::__cxx11::string::~string((string *)local_998);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)local_970,"DOWNLOAD cannot set user agent option: ",
                           (allocator *)(e_3.field_2._M_local_buf + 0xf));
                std::allocator<char>::~allocator
                          ((allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
                pcVar7 = curl_easy_strerror(e.field_2._12_4_);
                std::__cxx11::string::operator+=((string *)local_970,pcVar7);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_970);
                this_local._7_1_ = 0;
                local_1d8 = 1;
                std::__cxx11::string::~string((string *)local_970);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_948,"DOWNLOAD cannot set http failure option: ",
                         (allocator *)(e_2.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
              pcVar7 = curl_easy_strerror(e.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_948,pcVar7);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_948);
              this_local._7_1_ = 0;
              local_1d8 = 1;
              std::__cxx11::string::~string((string *)local_948);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_920,"DOWNLOAD cannot set url: ",
                       (allocator *)(e_1.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
            pcVar7 = curl_easy_strerror(e.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_920,pcVar7);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_920);
            this_local._7_1_ = 0;
            local_1d8 = 1;
            std::__cxx11::string::~string((string *)local_920);
          }
          anon_unknown.dwarf_2dc1b7::cURLEasyGuard::~cURLEasyGuard
                    ((cURLEasyGuard *)&stack0xfffffffffffff708);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_8b8,"DOWNLOAD cannot open file for write.",
                   (allocator *)((long)&curl + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_8b8);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&curl + 7));
        this_local._7_1_ = 0;
        local_1d8 = 1;
      }
      std::ofstream::~ofstream(&local_898);
    }
    else {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::MakeDirectory(pcVar7);
      if (bVar2) goto LAB_005be142;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8,"DOWNLOAD error: cannot create directory \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errstring.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8,
                     "\' - Specify file by full path name and verify that you have directory creation and file write privileges."
                    );
      std::__cxx11::string::~string((string *)&fout.field_0x1f8);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_678);
      this_local._7_1_ = 0;
      local_1d8 = 1;
      std::__cxx11::string::~string((string *)local_678);
    }
    std::__cxx11::string::~string((string *)(errstring.field_2._M_local_buf + 8));
  }
LAB_005bfb46:
  cmsys::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68);
  std::__cxx11::string::~string((string *)&hash);
  std::__cxx11::string::~string((string *)(hashMatchMSG.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&timeout);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
LAB_005bfbec:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if(args.size() < 3)
    {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
    }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string expectedHash;
  std::string hashMatchMSG;
  cmsys::auto_ptr<cmCryptoHash> hash;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "TLS_VERIFY")
      {
      ++i;
      if(i != args.end())
        {
        tls_verify = cmSystemTools::IsOn(i->c_str());
        }
      else
        {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
        }
      }
    else if(*i == "TLS_CAINFO")
      {
      ++i;
      if(i != args.end())
        {
        cainfo = i->c_str();
        }
      else
        {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
        }
      }
    else if(*i == "EXPECTED_MD5")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
        }
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New("MD5"));
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }
    else if(*i == "EXPECTED_HASH")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
        }
      std::string::size_type pos = i->find("=");
      if(pos == std::string::npos)
        {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
        }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos+1));
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if(!hash.get())
        {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
        }
      hashMatchMSG = algo + " hash";
      }
    ++i;
    }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if(cmSystemTools::FileExists(file.c_str()) && hash.get())
    {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if(actualHash == expectedHash)
      {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if(!statusVar.empty())
        {
        std::ostringstream result;
        result << (int)0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar,
                                      result.str().c_str());
        }
      return true;
      }
    }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if(!cmSystemTools::FileExists(dir.c_str()) &&
     !cmSystemTools::MakeDirectory(dir.c_str()))
    {
    std::string errstring = "DOWNLOAD error: cannot create directory '"
      + dir + "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
    }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if(!fout)
    {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
    }

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
    }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if(tls_verify)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
    }
  else
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
    }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty())
    {
    this->SetError(cainfo_err);
    return false;
    }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
    }

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash.get())
    {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty())
      {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
      }

    if (expectedHash != actualHash)
      {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
        << "  for file: [" << file << "]" << std::endl
        << "    expected hash: [" << expectedHash << "]" << std::endl
        << "      actual hash: [" << actualHash << "]" << std::endl
        << "           status: [" << (int)res << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl
        ;
      this->SetError(oss.str());
      return false;
      }
    }

  if (!logVar.empty())
    {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, &*chunkDebug.begin());
    }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}